

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::TypedExpectation<MockProblemBuilder::Objective_&(int)>::~TypedExpectation
          (TypedExpectation<MockProblemBuilder::Objective_&(int)> *this)

{
  bool bVar1;
  reference ppvVar2;
  undefined8 *in_RDI;
  const_iterator it;
  ExpectationBase *in_stack_00000210;
  vector<const_void_*,_std::allocator<const_void_*>_> *in_stack_ffffffffffffffc8;
  ExpectationBase *in_stack_ffffffffffffffd0;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_10 [2];
  
  *in_RDI = &PTR__TypedExpectation_00433928;
  ExpectationBase::CheckActionCountIfNotDone(in_stack_00000210);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::begin(in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<void_const*const*,std::vector<void_const*,std::allocator<void_const*>>>::
  __normal_iterator<void_const**>
            ((__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              *)in_stack_ffffffffffffffd0,
             (__normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              *)in_stack_ffffffffffffffc8);
  while( true ) {
    std::vector<const_void_*,_std::allocator<const_void_*>_>::end(in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              ::operator*(local_10);
    in_stack_ffffffffffffffd0 = (ExpectationBase *)*ppvVar2;
    if (in_stack_ffffffffffffffd0 != (ExpectationBase *)0x0) {
      Action<MockProblemBuilder::Objective_&(int)>::~Action
                ((Action<MockProblemBuilder::Objective_&(int)> *)0x2f7b46);
      operator_delete(in_stack_ffffffffffffffd0,0x10);
    }
    __gnu_cxx::
    __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
    ::operator++(local_10);
  }
  Action<MockProblemBuilder::Objective_&(int)>::~Action
            ((Action<MockProblemBuilder::Objective_&(int)> *)0x2f7b74);
  Matcher<const_std::tuple<int>_&>::~Matcher((Matcher<const_std::tuple<int>_&> *)0x2f7b85);
  std::tuple<testing::Matcher<int>_>::~tuple((tuple<testing::Matcher<int>_> *)0x2f7b96);
  ExpectationBase::~ExpectationBase(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }